

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O2

utf8proc_ssize_t
duckdb::utf8proc_decompose_custom
          (utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *buffer,
          utf8proc_ssize_t bufsize,utf8proc_option_t options,utf8proc_custom_func custom_func,
          void *custom_data)

{
  utf8proc_int32_t uc_00;
  utf8proc_int32_t uc_01;
  utf8proc_ssize_t uVar1;
  utf8proc_property_t *puVar2;
  utf8proc_property_t *puVar3;
  long lVar4;
  utf8proc_int32_t *dst;
  long lVar5;
  long lVar6;
  utf8proc_ssize_t uStack_60;
  utf8proc_int32_t uc;
  utf8proc_int32_t *local_50;
  utf8proc_ssize_t local_48;
  utf8proc_option_t local_40;
  int boundclass;
  long local_38;
  
  local_40 = options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE);
  if ((options & (UTF8PROC_STRIPMARK|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) == UTF8PROC_STRIPMARK ||
      local_40 == (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) {
    uStack_60 = -5;
  }
  else {
    boundclass = 0;
    lVar6 = 0;
    lVar5 = 0;
    local_50 = (utf8proc_int32_t *)str;
    local_48 = bufsize;
    local_38 = strlen;
    do {
      if ((options & UTF8PROC_NULLTERM) == 0) {
        if (local_38 - lVar6 == 0 || local_38 < lVar6) {
LAB_01ee93df:
          if (local_40 == 0) {
            return lVar5;
          }
          if (lVar5 <= local_48) {
            local_48 = lVar5 + -1;
            lVar6 = 0;
            local_50 = buffer;
            while (lVar4 = lVar6, lVar4 < local_48) {
              uc_00 = local_50[lVar4];
              uc_01 = local_50[lVar4 + 1];
              lVar6 = lVar4 + 1;
              puVar2 = unsafe_get_property(uc_00);
              puVar3 = unsafe_get_property(uc_01);
              if ((puVar3->combining_class < puVar2->combining_class) &&
                 (0 < puVar3->combining_class)) {
                local_50[lVar4] = uc_01;
                local_50[lVar4 + 1] = uc_00;
                if (0 < lVar4) {
                  lVar6 = lVar4 + -1;
                }
              }
            }
            return lVar5;
          }
          return lVar5;
        }
        uVar1 = utf8proc_iterate((utf8proc_uint8_t *)((long)local_50 + lVar6),local_38 - lVar6,&uc);
        if (uc < 0) {
          return -3;
        }
        lVar6 = uVar1 + lVar6;
      }
      else {
        uVar1 = utf8proc_iterate((utf8proc_uint8_t *)((long)local_50 + lVar6),-1,&uc);
        if (uc < 0) {
          return -3;
        }
        lVar6 = uVar1 + lVar6;
        if (lVar6 < 0) break;
        if (uc == 0) goto LAB_01ee93df;
      }
      if (custom_func != (utf8proc_custom_func)0x0) {
        uc = (*custom_func)(uc,custom_data);
      }
      dst = buffer + lVar5;
      if (buffer == (utf8proc_int32_t *)0x0) {
        dst = (utf8proc_int32_t *)0x0;
      }
      uVar1 = local_48 - lVar5;
      if (uVar1 == 0 || local_48 < lVar5) {
        uVar1 = 0;
      }
      uVar1 = utf8proc_decompose_char(uc,dst,uVar1,options,&boundclass);
      if (uVar1 < 0) {
        return uVar1;
      }
      lVar5 = lVar5 + uVar1;
    } while (lVar5 < 0x1000000000000000);
    uStack_60 = -2;
  }
  return uStack_60;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_custom(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen,
  utf8proc_int32_t *buffer, utf8proc_ssize_t bufsize, utf8proc_option_t options,
  utf8proc_custom_func custom_func, void *custom_data
) {
  /* strlen will be ignored, if UTF8PROC_NULLTERM is set in options */
  utf8proc_ssize_t wpos = 0;
  if ((options & UTF8PROC_COMPOSE) && (options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  if ((options & UTF8PROC_STRIPMARK) &&
      !(options & UTF8PROC_COMPOSE) && !(options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  {
    utf8proc_int32_t uc;
    utf8proc_ssize_t rpos = 0;
    utf8proc_ssize_t decomp_result;
    int boundclass = UTF8PROC_BOUNDCLASS_START;
    while (1) {
      if (options & UTF8PROC_NULLTERM) {
        rpos += utf8proc_iterate(str + rpos, -1, &uc);
        /* checking of return value is not necessary,
           as 'uc' is < 0 in case of error */
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
        if (rpos < 0) return UTF8PROC_ERROR_OVERFLOW;
        if (uc == 0) break;
      } else {
        if (rpos >= strlen) break;
        rpos += utf8proc_iterate(str + rpos, strlen - rpos, &uc);
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
      }
      if (custom_func != NULL) {
        uc = custom_func(uc, custom_data);   /* user-specified custom mapping */
      }
      decomp_result = utf8proc_decompose_char(
        uc, buffer ? buffer + wpos : nullptr, (bufsize > wpos) ? (bufsize - wpos) : 0, options,
        &boundclass
      );
      if (decomp_result < 0) return decomp_result;
      wpos += decomp_result;
      /* prohibiting integer overflows due to too long strings: */
      if (wpos < 0 ||
          wpos > (utf8proc_ssize_t)(SSIZE_MAX/sizeof(utf8proc_int32_t)/2))
        return UTF8PROC_ERROR_OVERFLOW;
    }
  }
  if ((options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) && bufsize >= wpos) {
    utf8proc_ssize_t pos = 0;
    while (pos < wpos-1) {
      utf8proc_int32_t uc1, uc2;
      const utf8proc_property_t *property1, *property2;
      uc1 = buffer[pos];
      uc2 = buffer[pos+1];
      property1 = unsafe_get_property(uc1);
      property2 = unsafe_get_property(uc2);
      if (property1->combining_class > property2->combining_class &&
          property2->combining_class > 0) {
        buffer[pos] = uc2;
        buffer[pos+1] = uc1;
        if (pos > 0) pos--; else pos++;
          } else {
            pos++;
          }
    }
  }
  return wpos;
}